

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void parse_block(LexState *ls)

{
  FuncState *fs;
  FuncScope bl;
  FuncScope local_18;
  
  fs = ls->fs;
  local_18.nactvar = (uint8_t)fs->nactvar;
  local_18.flags = '\0';
  local_18.vstart = fs->ls->vtop;
  local_18.prev = fs->bl;
  fs->bl = &local_18;
  parse_chunk(ls);
  fscope_end(fs);
  return;
}

Assistant:

static void parse_block(LexState *ls)
{
  FuncState *fs = ls->fs;
  FuncScope bl;
  fscope_begin(fs, &bl, 0);
  parse_chunk(ls);
  fscope_end(fs);
}